

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_base_clock(envy_bios *bios)

{
  uint uVar1;
  envy_bios_power_base_clock_entry *peVar2;
  uint16_t *puVar3;
  uint16_t local_3e;
  uint local_3c;
  uint16_t clock;
  envy_bios_power_base_clock_entry *peStack_38;
  uint32_t suboffset;
  envy_bios_power_base_clock_entry *bce;
  int local_28;
  int err;
  int j;
  int i;
  envy_bios_power_base_clock *bc;
  envy_bios *bios_local;
  
  _j = &(bios->power).base_clock;
  bce._4_4_ = 0;
  if (_j->offset == 0) {
    return -0x16;
  }
  bc = (envy_bios_power_base_clock *)bios;
  bios_u8(bios,_j->offset,&(bios->power).base_clock.version);
  if (_j->version == '\x10') {
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 1,&_j->hlen);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 2,&_j->rlen);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 3,&_j->selen);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 4,&_j->secount);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 5,&_j->entriesnum);
    bce._4_4_ = uVar1 | bce._4_4_;
    _j->valid = (bce._4_4_ != 0 ^ 0xffU) & 1;
    if (_j->valid == '\0') {
      return -0x16;
    }
    bios_u8((envy_bios *)bc,_j->offset + 6,&_j->d2_entry);
    bios_u8((envy_bios *)bc,_j->offset + 7,&_j->d3_entry);
    bios_u8((envy_bios *)bc,_j->offset + 8,&_j->d4_entry);
    bios_u8((envy_bios *)bc,_j->offset + 9,&_j->d5_entry);
    bios_u8((envy_bios *)bc,_j->offset + 10,&_j->over_current_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xb,&_j->vrhot_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xc,&_j->max_batt_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xd,&_j->max_sli_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xe,&_j->max_therm_sustain_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xf,&_j->boost_entry);
    if (_j->hlen < 0x11) {
      _j->turbo_boost_entry = 0xff;
    }
    else {
      bios_u8((envy_bios *)bc,_j->offset + 0x10,&_j->turbo_boost_entry);
    }
    if (_j->hlen < 0x12) {
      _j->rated_tdp_entry = 0xff;
    }
    else {
      bios_u8((envy_bios *)bc,_j->offset + 0x11,&_j->rated_tdp_entry);
    }
    if (_j->hlen < 0x13) {
      _j->slowdown_pwr_entry = 0xff;
    }
    else {
      bios_u8((envy_bios *)bc,_j->offset + 0x12,&_j->slowdown_pwr_entry);
    }
    if (_j->hlen < 0x14) {
      _j->mid_point_entry = 0xff;
    }
    else {
      bios_u8((envy_bios *)bc,_j->offset + 0x13,&_j->mid_point_entry);
    }
    if (_j->hlen < 0x16) {
      _j->unk15_entry = 0xff;
    }
    else {
      bios_u8((envy_bios *)bc,_j->offset + 0x15,&_j->unk15_entry);
    }
    if (_j->hlen < 0x17) {
      _j->unk16_entry = 0xff;
    }
    else {
      bios_u8((envy_bios *)bc,_j->offset + 0x16,&_j->unk16_entry);
    }
  }
  else {
    if (_j->version != ' ') {
      fprintf(_stderr,"BASE CLOCKS table version 0x%x\n",(ulong)_j->version);
      return -0x16;
    }
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 1,&_j->hlen);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 2,&_j->rlen);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 3,&_j->entriesnum);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 4,&_j->secount);
    bce._4_4_ = uVar1 | bce._4_4_;
    uVar1 = bios_u8((envy_bios *)bc,_j->offset + 5,&_j->selen);
    bce._4_4_ = uVar1 | bce._4_4_;
    _j->valid = (bce._4_4_ != 0 ^ 0xffU) & 1;
    if (_j->valid == '\0') {
      return -0x16;
    }
    bios_u8((envy_bios *)bc,_j->offset + 6,&_j->boost_entry);
    bios_u8((envy_bios *)bc,_j->offset + 7,&_j->turbo_boost_entry);
    bios_u8((envy_bios *)bc,_j->offset + 8,&_j->rated_tdp_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xc,&_j->vrhot_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xd,&_j->max_batt_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xe,&_j->unk15_entry);
    bios_u8((envy_bios *)bc,_j->offset + 0xf,&_j->unk16_entry);
  }
  bce._4_4_ = 0;
  peVar2 = (envy_bios_power_base_clock_entry *)malloc((ulong)_j->entriesnum * 0x18);
  _j->entries = peVar2;
  for (err = 0; err < (int)(uint)_j->entriesnum; err = err + 1) {
    peStack_38 = _j->entries + err;
    peStack_38->offset =
         _j->offset + (uint)_j->hlen + err * ((uint)_j->rlen + (uint)_j->selen * (uint)_j->secount);
    bios_u8((envy_bios *)bc,peStack_38->offset,&peStack_38->pstate);
    if (_j->version == '\x10') {
      bios_u16((envy_bios *)bc,peStack_38->offset + 1,&peStack_38->reqPower);
      bios_u16((envy_bios *)bc,peStack_38->offset + 3,&peStack_38->reqSlowdownPower);
    }
    puVar3 = (uint16_t *)malloc((ulong)_j->secount << 1);
    peStack_38->clock = puVar3;
    for (local_28 = 0; local_28 < (int)(uint)_j->secount; local_28 = local_28 + 1) {
      local_3c = peStack_38->offset + (uint)_j->rlen + local_28 * (uint)_j->selen;
      if (_j->version == '\x10') {
        bios_u16((envy_bios *)bc,local_3c,peStack_38->clock + local_28);
      }
      else if (_j->version == ' ') {
        bios_u16((envy_bios *)bc,local_3c + 2,&local_3e);
        peStack_38->clock[local_28] = local_3e << 2;
      }
    }
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_base_clock(struct envy_bios *bios) {
	struct envy_bios_power_base_clock *bc = &bios->power.base_clock;
	int i, j, err = 0;

	if (!bc->offset)
		return -EINVAL;

	bios_u8(bios, bc->offset + 0x0, &bc->version);
	switch(bc->version) {
	case 0x10:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->selen);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->entriesnum);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->d2_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->d3_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->d4_entry);
			bios_u8(bios, bc->offset + 0x09, &bc->d5_entry);
			bios_u8(bios, bc->offset + 0x0a, &bc->over_current_entry);
			bios_u8(bios, bc->offset + 0x0b, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_sli_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->max_therm_sustain_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->boost_entry);
			if (bc->hlen > 0x10)
				bios_u8(bios, bc->offset + 0x10, &bc->turbo_boost_entry);
			else
				bc->turbo_boost_entry = 0xff;
			if (bc->hlen > 0x11)
				bios_u8(bios, bc->offset + 0x11, &bc->rated_tdp_entry);
			else
				bc->rated_tdp_entry = 0xff;
			if (bc->hlen > 0x12)
				bios_u8(bios, bc->offset + 0x12, &bc->slowdown_pwr_entry);
			else
				bc->slowdown_pwr_entry = 0xff;
			if (bc->hlen > 0x13)
				bios_u8(bios, bc->offset + 0x13, &bc->mid_point_entry);
			else
				bc->mid_point_entry = 0xff;
			if (bc->hlen > 0x15)
				bios_u8(bios, bc->offset + 0x15, &bc->unk15_entry);
			else
				bc->unk15_entry = 0xff;
			if (bc->hlen > 0x16)
				bios_u8(bios, bc->offset + 0x16, &bc->unk16_entry);
			else
				bc->unk16_entry = 0xff;
		} else {
			return -EINVAL;
		}

		break;
	case 0x20:
		err |= bios_u8(bios, bc->offset + 0x1, &bc->hlen);
		err |= bios_u8(bios, bc->offset + 0x2, &bc->rlen);
		err |= bios_u8(bios, bc->offset + 0x3, &bc->entriesnum);
		err |= bios_u8(bios, bc->offset + 0x4, &bc->secount);
		err |= bios_u8(bios, bc->offset + 0x5, &bc->selen);
		bc->valid = !err;

		if (bc->valid) {
			bios_u8(bios, bc->offset + 0x06, &bc->boost_entry);
			bios_u8(bios, bc->offset + 0x07, &bc->turbo_boost_entry);
			bios_u8(bios, bc->offset + 0x08, &bc->rated_tdp_entry);
			bios_u8(bios, bc->offset + 0x0c, &bc->vrhot_entry);
			bios_u8(bios, bc->offset + 0x0d, &bc->max_batt_entry);
			bios_u8(bios, bc->offset + 0x0e, &bc->unk15_entry);
			bios_u8(bios, bc->offset + 0x0f, &bc->unk16_entry);
		} else {
			return -EINVAL;
		}

		break;
	default:
		ENVY_BIOS_ERR("BASE CLOCKS table version 0x%x\n", bc->version);
		return -EINVAL;
	};

	err = 0;
	bc->entries = malloc(bc->entriesnum * sizeof(struct envy_bios_power_base_clock_entry));
	for (i = 0; i < bc->entriesnum; i++) {
		struct envy_bios_power_base_clock_entry *bce = &bc->entries[i];

		bce->offset = bc->offset + bc->hlen + i * (bc->rlen + (bc->selen * bc->secount));
		bios_u8(bios, bce->offset, &bce->pstate);

		if (bc->version == 0x10) {
			bios_u16(bios, bce->offset + 0x1, &bce->reqPower);
			bios_u16(bios, bce->offset + 0x3, &bce->reqSlowdownPower);
		}

		bce->clock = malloc(bc->secount * sizeof(uint16_t));
		for (j = 0; j < bc->secount; j++) {
			uint32_t suboffset = bce->offset + bc->rlen + j * bc->selen;
			uint16_t clock;
			switch (bc->version) {
			case 0x10:
				bios_u16(bios, suboffset, &bce->clock[j]);
				break;
			case 0x20:
				bios_u16(bios, suboffset + 0x2, &clock);
				bce->clock[j] = clock * 4;
				break;
			}
		}
	}

	return 0;
}